

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O0

char * decompose_alias(char *suffix)

{
  char *pcVar1;
  char *suffix_local;
  
  pcVar1 = get_suffix_code(decompose_alias::alias,suffix);
  return pcVar1;
}

Assistant:

static const char *
decompose_alias(const char *suffix)
{
	static const struct suffix_code_t alias[] = {
		{ ".taz",	".tar.gz" },
		{ ".tgz",	".tar.gz" },
		{ ".tbz",	".tar.bz2" },
		{ ".tbz2",	".tar.bz2" },
		{ ".tz2",	".tar.bz2" },
		{ ".tlz",	".tar.lzma" },
		{ ".txz",	".tar.xz" },
		{ ".tzo",	".tar.lzo" },
		{ ".taZ",	".tar.Z" },
		{ ".tZ",	".tar.Z" },
		{ ".tzst",	".tar.zst" },
		{ NULL,		NULL }
	};

	return get_suffix_code(alias, suffix);
}